

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexCompareVerifier.cpp
# Opt level: O3

bool tcu::isTrilinearCompareValid
               (CompareMode compareMode,TexComparePrecision *prec,Vec4 *depths0,Vec4 *depths1,
               Vec2 *xBounds0,Vec2 *yBounds0,Vec2 *xBounds1,Vec2 *yBounds1,Vec2 *fBounds,
               float cmpReference,float result,bool isFixedPointDepth)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  CmpResultSet CVar4;
  CmpResultSet CVar5;
  CmpResultSet CVar6;
  CmpResultSet CVar7;
  uint uVar8;
  undefined6 extraout_var;
  undefined6 extraout_var_00;
  undefined6 extraout_var_01;
  undefined6 extraout_var_02;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  undefined4 *puVar13;
  byte bVar14;
  undefined4 *puVar15;
  int i;
  long lVar16;
  undefined4 *puVar17;
  byte bVar18;
  uint uVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar26;
  ulong uVar25;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  Vec4 refVal1;
  Vec4 refVal0;
  byte local_150 [3];
  bool local_14d;
  byte local_14c [4];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_118 [16];
  uint local_108;
  uint local_f8;
  undefined1 local_e8 [8];
  float fStack_e0;
  float fStack_dc;
  Vec2 *local_d8;
  Vec2 *local_c8;
  int local_b8;
  undefined4 uStack_b4;
  float local_a8;
  undefined1 local_98 [16];
  undefined1 local_88 [8];
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [16];
  
  _local_b8 = CONCAT44(uStack_b4,prec->pcfBits);
  local_d8 = yBounds0;
  local_c8 = xBounds0;
  local_a8 = result;
  local_148._0_4_ = cmpReference;
  CVar4 = execCompare(compareMode,depths0->m_data[0],cmpReference,prec->referenceBits,
                      isFixedPointDepth);
  local_138._0_4_ = (undefined4)CONCAT62(extraout_var,CVar4);
  CVar4 = execCompare(compareMode,depths0->m_data[1],(float)local_148._0_4_,prec->referenceBits,
                      isFixedPointDepth);
  local_118._0_4_ = (int)CONCAT62(extraout_var_00,CVar4);
  CVar4 = execCompare(compareMode,depths0->m_data[2],(float)local_148._0_4_,prec->referenceBits,
                      isFixedPointDepth);
  CVar5 = execCompare(compareMode,depths0->m_data[3],(float)local_148._0_4_,prec->referenceBits,
                      isFixedPointDepth);
  local_108 = (uint)CONCAT62(extraout_var_01,CVar5);
  CVar5 = execCompare(compareMode,depths1->m_data[0],(float)local_148._0_4_,prec->referenceBits,
                      isFixedPointDepth);
  local_f8 = (uint)CONCAT62(extraout_var_02,CVar5);
  CVar5 = execCompare(compareMode,depths1->m_data[1],(float)local_148._0_4_,prec->referenceBits,
                      isFixedPointDepth);
  CVar6 = execCompare(compareMode,depths1->m_data[2],(float)local_148._0_4_,prec->referenceBits,
                      isFixedPointDepth);
  CVar7 = execCompare(compareMode,depths1->m_data[3],(float)local_148._0_4_,prec->referenceBits,
                      isFixedPointDepth);
  if (local_b8 < 1) {
    local_148._0_12_ = ZEXT812(0x3f800000);
    local_148._12_4_ = 0;
    if ((((((local_138._0_4_ & 1) == 0) &&
          ((local_118 & (undefined1  [16])0x1) == (undefined1  [16])0x0)) &&
         (((ushort)CVar4 & 1) == 0)) && (((local_108 & 1) == 0 && ((local_f8 & 1) == 0)))) &&
       ((((ushort)CVar5 & 1) == 0 && (((ushort)CVar6 & 1) == 0)))) {
      if (((ushort)CVar7 & 1) == 0) {
        local_148 = ZEXT816(0);
      }
      else {
        local_148._0_12_ = ZEXT812(0x3f800000);
        local_148._12_4_ = 0;
      }
    }
    uVar25 = (ulong)(uint)local_138._0_4_;
    local_138 = (undefined1  [16])0x0;
    if (((((local_f8 | (ushort)CVar5) >> 8 & 1) == 0 && ((ushort)CVar6 >> 8 & 1) == 0) &&
         ((uVar25 & 0xffffffff0000ffff | (ulong)local_118._0_2_ << 0x10 |
           (ulong)(ushort)CVar4 << 0x20 | (ulong)(ushort)local_108 << 0x30) & (ulong)DAT_00b62f40)
         == 0) && (((ushort)CVar7 >> 8 & 1) == 0)) {
      local_138 = ZEXT416(0x3f800000);
    }
    fVar24 = TexVerifierUtil::computeFixedPointError(prec->resultBits);
    bVar18 = -((float)local_138._0_4_ - fVar24 <= local_a8 &&
              local_a8 <= (float)local_148._0_4_ + fVar24);
  }
  else {
    uVar8 = local_138._0_4_ & 1;
    uVar9 = local_118._0_4_ & 1;
    uVar10 = local_108 & 1;
    uVar3 = local_f8 & 1;
    uVar12 = (ushort)CVar7 >> 1 & 0x80 |
             (ushort)CVar6 >> 2 & 0x40 |
             (ushort)CVar5 >> 3 & 0x20 |
             local_f8 >> 4 & 0x10 |
             local_108 >> 5 & 8 |
             (ushort)CVar4 >> 6 & 4 |
             (uint)local_118._0_4_ >> 7 & 2 | (uint)local_138._0_4_ >> 8 & 1;
    local_148._0_4_ = TexVerifierUtil::computeFixedPointError(prec->pcfBits);
    fVar20 = TexVerifierUtil::computeFixedPointError(prec->resultBits);
    fVar24 = local_d8->m_data[0];
    fVar1 = local_d8->m_data[1];
    fVar30 = 1.0 - fVar24;
    fVar21 = (float)*(undefined8 *)local_c8->m_data;
    fVar26 = (float)((ulong)*(undefined8 *)local_c8->m_data >> 0x20);
    fVar22 = 1.0 - fVar1;
    fVar2 = yBounds1->m_data[0];
    local_58 = yBounds1->m_data[1];
    fVar37 = 1.0 - fVar2;
    local_68 = *(undefined8 *)xBounds1->m_data;
    uStack_60 = 0;
    fVar32 = (float)local_68;
    local_78 = 1.0 - fVar32;
    fVar35 = (float)((ulong)local_68 >> 0x20);
    fStack_74 = 1.0 - fVar35;
    uStack_70 = 0;
    uStack_6c = 0;
    fVar27 = 1.0 - local_58;
    fVar33 = (float)*(undefined8 *)fBounds->m_data;
    fVar36 = (float)((ulong)*(undefined8 *)fBounds->m_data >> 0x20);
    fStack_54 = local_58;
    fStack_50 = local_58;
    fStack_4c = local_58;
    uVar11 = 0;
    bVar18 = true;
    _local_e8 = ZEXT816(0);
    do {
      if ((((((ushort)CVar7 & 1) << 7 |
            ((ushort)CVar6 & 1) << 6 |
            ((ushort)CVar5 & 1) << 5 |
            uVar3 << 4 | uVar8 + uVar9 * 2 + ((ushort)CVar4 & 1) * 4 + uVar10 * 8) ^ uVar12) &
           uVar11 ^ uVar12) == 0xff) {
        bVar14 = (byte)uVar11;
        local_14c[0] = bVar14 & 1;
        local_14c[1] = bVar14 >> 1 & 1;
        local_150[0] = bVar14 >> 4 & 1;
        local_150[1] = bVar14 >> 5 & 1;
        local_150[2] = bVar14 >> 6 & 1;
        local_14d = 0x7f < uVar11;
        local_14c[2] = bVar14 >> 2 & 1;
        local_14c[3] = bVar14 >> 3 & 1;
        local_98 = _local_e8;
        _local_88 = _local_e8;
        lVar16 = 0;
        puVar13 = (undefined4 *)local_e8;
        puVar15 = (undefined4 *)local_98;
        do {
          puVar17 = puVar13;
          if (local_14c[lVar16] == 0) {
            puVar17 = puVar15;
          }
          *(undefined4 *)(local_88 + lVar16 * 4) = *puVar17;
          lVar16 = lVar16 + 1;
          puVar15 = puVar15 + 1;
          puVar13 = puVar13 + 1;
        } while (lVar16 != 4);
        local_98._8_4_ = 0x3f800000;
        local_98._0_8_ = 0x3f8000003f800000;
        local_98._12_4_ = 0x3f800000;
        local_48 = _local_e8;
        lVar16 = 0;
        puVar13 = (undefined4 *)local_98;
        puVar15 = (undefined4 *)local_48;
        do {
          puVar17 = puVar13;
          if (local_150[lVar16] == 0) {
            puVar17 = puVar15;
          }
          *(undefined4 *)(local_e8 + lVar16 * 4) = *puVar17;
          lVar16 = lVar16 + 1;
          puVar15 = puVar15 + 1;
          puVar13 = puVar13 + 1;
        } while (lVar16 != 4);
        fVar28 = (float)local_88._0_4_ * (1.0 - fVar21);
        fVar29 = (float)local_88._0_4_ * (1.0 - fVar26);
        fVar34 = fStack_80 * (1.0 - fVar21);
        fStack_80 = fStack_80 * (1.0 - fVar26);
        fVar40 = fStack_7c * fVar21 * fVar24 +
                 fVar34 * fVar24 + fVar28 * fVar30 + fVar30 * (float)local_88._4_4_ * fVar21;
        fVar23 = fStack_7c * fVar26 * fVar24 +
                 fStack_80 * fVar24 + fVar29 * fVar30 + (float)local_88._4_4_ * fVar26 * fVar30;
        fVar42 = fStack_7c * fVar21 * fVar1 +
                 fVar34 * fVar1 + fVar28 * fVar22 + fVar22 * (float)local_88._4_4_ * fVar21;
        fVar43 = fStack_7c * fVar26 * fVar1 +
                 fStack_80 * fVar1 + fVar29 * fVar22 + fVar22 * (float)local_88._4_4_ * fVar26;
        fVar28 = (float)(~-(uint)(fVar42 <= fVar43) & (uint)fVar43 |
                        -(uint)(fVar42 <= fVar43) & (uint)fVar42);
        uVar19 = -(uint)(fVar23 <= fVar28);
        fVar28 = (float)(uVar19 & (uint)fVar23 | ~uVar19 & (uint)fVar28);
        uVar19 = -(uint)(fVar40 <= fVar28);
        fVar38 = (float)(uVar19 & (uint)fVar40 | ~uVar19 & (uint)fVar28);
        fVar41 = fStack_dc * fVar32 * fVar2 +
                 fStack_e0 * local_78 * fVar2 +
                 (float)local_e8._0_4_ * local_78 * fVar37 + fVar37 * (float)local_e8._4_4_ * fVar32
        ;
        fVar34 = fStack_dc * fVar35 * fVar2 +
                 fStack_e0 * fStack_74 * fVar2 +
                 (float)local_e8._0_4_ * fStack_74 * fVar37 +
                 (float)local_e8._4_4_ * fVar35 * fVar37;
        fVar28 = fStack_dc * fVar32 * local_58 +
                 fStack_e0 * local_78 * local_58 +
                 (float)local_e8._0_4_ * local_78 * fVar27 + fVar27 * (float)local_e8._4_4_ * fVar32
        ;
        fVar29 = fStack_dc * fVar35 * local_58 +
                 fStack_e0 * fStack_74 * local_58 +
                 (float)local_e8._0_4_ * fStack_74 * fVar27 +
                 fVar27 * (float)local_e8._4_4_ * fVar35;
        fVar31 = (float)(~-(uint)(fVar28 <= fVar29) & (uint)fVar29 |
                        -(uint)(fVar28 <= fVar29) & (uint)fVar28);
        uVar19 = -(uint)(fVar34 <= fVar31);
        fVar31 = (float)(uVar19 & (uint)fVar34 | ~uVar19 & (uint)fVar31);
        uVar19 = -(uint)(fVar41 <= fVar31);
        fVar31 = (float)(uVar19 & (uint)fVar41 | ~uVar19 & (uint)fVar31);
        fVar39 = fVar38 * (1.0 - fVar33) + fVar31 * fVar33;
        fVar31 = fVar38 * (1.0 - fVar36) + fVar31 * fVar36;
        uVar19 = -(uint)(fVar39 <= fVar31);
        _local_e8 = ZEXT812(0);
        fStack_dc = 0.0;
        if (((float)(~uVar19 & (uint)fVar31 | (uint)fVar39 & uVar19) -
             (fVar20 + (float)local_148._0_4_) <= local_a8) &&
           (fVar31 = (float)(~-(uint)(fVar43 <= fVar42) & (uint)fVar43 |
                            (uint)fVar42 & -(uint)(fVar43 <= fVar42)),
           uVar19 = -(uint)(fVar31 <= fVar23),
           fVar23 = (float)(uVar19 & (uint)fVar23 | ~uVar19 & (uint)fVar31),
           uVar19 = -(uint)(fVar23 <= fVar40),
           fVar23 = (float)(uVar19 & (uint)fVar40 | ~uVar19 & (uint)fVar23),
           fVar28 = (float)(~-(uint)(fVar29 <= fVar28) & (uint)fVar29 |
                           (uint)fVar28 & -(uint)(fVar29 <= fVar28)),
           uVar19 = -(uint)(fVar28 <= fVar34),
           fVar28 = (float)(uVar19 & (uint)fVar34 | ~uVar19 & (uint)fVar28),
           uVar19 = -(uint)(fVar28 <= fVar41),
           fVar29 = (float)(uVar19 & (uint)fVar41 | ~uVar19 & (uint)fVar28),
           fVar28 = fVar23 * (1.0 - fVar33) + fVar29 * fVar33,
           fVar23 = fVar23 * (1.0 - fVar36) + fVar29 * fVar36, uVar19 = -(uint)(fVar23 <= fVar28),
           local_a8 <=
           (float)(~uVar19 & (uint)fVar23 | (uint)fVar28 & uVar19) + fVar20 + (float)local_148._0_4_
           )) break;
      }
      bVar18 = uVar11 < 0xff;
      uVar11 = uVar11 + 1;
    } while (uVar11 != 0x100);
  }
  return (bool)(bVar18 & 1);
}

Assistant:

static bool isTrilinearCompareValid (const Sampler::CompareMode	compareMode,
									 const TexComparePrecision&	prec,
									 const Vec4&				depths0,
									 const Vec4&				depths1,
									 const Vec2&				xBounds0,
									 const Vec2&				yBounds0,
									 const Vec2&				xBounds1,
									 const Vec2&				yBounds1,
									 const Vec2&				fBounds,
									 const float				cmpReference,
									 const float				result,
									 const bool					isFixedPointDepth)
{
	if (prec.pcfBits > 0)
		return isTrilinearPCFCompareValid(compareMode, prec, depths0, depths1, xBounds0, yBounds0, xBounds1, yBounds1, fBounds, cmpReference, result, isFixedPointDepth);
	else
		return isTrilinearAnyCompareValid(compareMode, prec, depths0, depths1, cmpReference, result, isFixedPointDepth);
}